

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

pair<google::dense_hashtable_iterator<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>,_bool>
* __thiscall
google::
dense_hashtable<A,A,HashA,google::dense_hash_set<A,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<A>>::Identity,google::dense_hash_set<A,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<A>>::SetKey,std::equal_to<A>,google::libc_allocator_with_realloc<A>>
::insert_noresize<A_const&,A>
          (pair<google::dense_hashtable_iterator<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>,_bool>
           *__return_storage_ptr__,
          dense_hashtable<A,A,HashA,google::dense_hash_set<A,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<A>>::Identity,google::dense_hash_set<A,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<A>>::SetKey,std::equal_to<A>,google::libc_allocator_with_realloc<A>>
          *this,A *key,A *args)

{
  long lVar1;
  long lVar2;
  unsigned_long uVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  
  pVar4 = dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
          ::find_position<A>((dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
                              *)this,key);
  uVar3 = pVar4.first;
  if (uVar3 == 0xffffffffffffffff) {
    dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
    ::insert_at<A>(&__return_storage_ptr__->first,
                   (dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
                    *)this,pVar4.second,args);
  }
  else {
    lVar1 = *(long *)(this + 0x38);
    lVar2 = *(long *)(this + 0x48);
    (__return_storage_ptr__->first).ht =
         (dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
          *)this;
    (__return_storage_ptr__->first).pos = (pointer)(lVar2 + uVar3 * 4);
    (__return_storage_ptr__->first).end = (pointer)(lVar2 + lVar1 * 4);
  }
  __return_storage_ptr__->second = uVar3 == 0xffffffffffffffff;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert_noresize(K&& key, Args&&... args) {
    // First, double-check we're not inserting delkey or emptyval
    assert(settings.use_empty() && "Inserting without empty key");
    assert(!equals(std::forward<K>(key), key_info.empty_key) && "Inserting the empty key");
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) && "Inserting the deleted key");

    const std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first != ILLEGAL_BUCKET) {  // object was already there
      return std::pair<iterator, bool>(
          iterator(this, table + pos.first, table + num_buckets, false),
          false);  // false: we didn't insert
    } else {       // pos.second says where to put it
      return std::pair<iterator, bool>(insert_at(pos.second, std::forward<Args>(args)...), true);
    }
  }